

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_mark_relax(REF_SHARD ref_shard)

{
  REF_STATUS RVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  REF_BOOL local_24;
  REF_INT cell;
  REF_BOOL again;
  REF_CELL ref_cell;
  REF_SHARD ref_shard_local;
  
  _cell = ref_shard->grid->cell[0xb];
  local_24 = 1;
  ref_cell = (REF_CELL)ref_shard;
  do {
    if (local_24 == 0) {
      return 0;
    }
    local_24 = 0;
    for (nodes[0x1a] = 0; nodes[0x1a] < _cell->max; nodes[0x1a] = nodes[0x1a] + 1) {
      RVar1 = ref_cell_nodes(_cell,nodes[0x1a],&ref_private_macro_code_rss_1);
      if (RVar1 == 0) {
        uVar2 = ref_shard_pair((REF_SHARD)ref_cell,&local_24,ref_private_macro_code_rss,nodes[2],
                               nodes[0],nodes[5]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0xf2,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
          return uVar2;
        }
        uVar2 = ref_shard_pair((REF_SHARD)ref_cell,&local_24,nodes[3],ref_private_macro_code_rss_1,
                               nodes[4],nodes[1]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0xf5,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
          return uVar2;
        }
        uVar2 = ref_shard_pair((REF_SHARD)ref_cell,&local_24,ref_private_macro_code_rss,nodes[4],
                               ref_private_macro_code_rss_1,nodes[5]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0xf9,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
          return uVar2;
        }
        uVar2 = ref_shard_pair((REF_SHARD)ref_cell,&local_24,nodes[3],nodes[0],nodes[2],nodes[1]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0xfc,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
          return uVar2;
        }
        uVar2 = ref_shard_pair((REF_SHARD)ref_cell,&local_24,ref_private_macro_code_rss_1,nodes[0],
                               nodes[2],nodes[4]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x100,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
          return uVar2;
        }
        uVar2 = ref_shard_pair((REF_SHARD)ref_cell,&local_24,ref_private_macro_code_rss,nodes[1],
                               nodes[3],nodes[5]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x103,"ref_shard_mark_relax",(ulong)uVar2,"not consist");
          return uVar2;
        }
      }
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_shard_mark_relax(REF_SHARD ref_shard) {
  REF_CELL ref_cell;
  REF_BOOL again;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_hex(ref_shard_grid(ref_shard));

  again = REF_TRUE;

  while (again) {
    again = REF_FALSE;

    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[4], nodes[2],
                         nodes[7]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[5], nodes[0], nodes[6],
                         nodes[3]),
          "not consist");

      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[6], nodes[0],
                         nodes[7]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[5], nodes[2], nodes[4],
                         nodes[3]),
          "not consist");

      RSS(ref_shard_pair(ref_shard, &again, nodes[0], nodes[2], nodes[4],
                         nodes[6]),
          "not consist");
      RSS(ref_shard_pair(ref_shard, &again, nodes[1], nodes[3], nodes[5],
                         nodes[7]),
          "not consist");
    }
  }

  return REF_SUCCESS;
}